

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O3

bool serialize_tests::isCanonicalException(failure *ex)

{
  int iVar1;
  char *__s1;
  char *__s2;
  long in_FS_OFFSET;
  failure expectedException;
  failure_abi_cxx11_ local_40 [32];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  std::iostream_category();
  std::ios_base::failure[abi:cxx11]::failure
            ((char *)local_40,(error_code *)"non-canonical ReadCompactSize()");
  __s1 = (char *)std::ios_base::failure[abi:cxx11]::what();
  __s2 = (char *)(**(code **)(*(long *)ex + 0x10))(ex);
  iVar1 = strcmp(__s1,__s2);
  std::ios_base::failure[abi:cxx11]::~failure(local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar1 == 0;
  }
  __stack_chk_fail();
}

Assistant:

static bool isCanonicalException(const std::ios_base::failure& ex)
{
    std::ios_base::failure expectedException("non-canonical ReadCompactSize()");

    // The string returned by what() can be different for different platforms.
    // Instead of directly comparing the ex.what() with an expected string,
    // create an instance of exception to see if ex.what() matches
    // the expected explanatory string returned by the exception instance.
    return strcmp(expectedException.what(), ex.what()) == 0;
}